

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

App * __thiscall
CLI::App::_find_subcommand(App *this,string *subc_name,bool ignore_disabled,bool ignore_used)

{
  bool bVar1;
  byte bVar2;
  element_type *peVar3;
  App *pAVar4;
  element_type *peVar5;
  string local_90;
  undefined8 local_70;
  App *subc;
  __shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2> *local_48;
  App_p *com;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_> *__range2;
  bool ignore_used_local;
  bool ignore_disabled_local;
  string *subc_name_local;
  App *this_local;
  
  __end2 = std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>::
           begin(&this->subcommands_);
  com = (App_p *)std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                 ::end(&this->subcommands_);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
                                *)&com);
    if (!bVar1) {
      return (App *)0x0;
    }
    local_48 = &__gnu_cxx::
                __normal_iterator<const_std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
                ::operator*(&__end2)->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>;
    peVar3 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_48);
    if (((peVar3->disabled_ & 1U) == 0) || (!ignore_disabled)) {
      peVar3 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                          )local_48);
      get_name_abi_cxx11_((string *)&subc,peVar3);
      bVar2 = ::std::__cxx11::string::empty();
      ::std::__cxx11::string::~string((string *)&subc);
      if ((bVar2 & 1) == 0) {
        peVar3 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_48);
        ::std::__cxx11::string::string((string *)&local_90,(string *)subc_name);
        bVar1 = check_name(peVar3,&local_90);
        ::std::__cxx11::string::~string((string *)&local_90);
        if (bVar1) {
          peVar3 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator*((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_48);
          bVar1 = operator_cast_to_bool(peVar3);
          if ((!bVar1) || (!ignore_used)) {
            peVar5 = std::__shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>::get(local_48);
            return peVar5;
          }
        }
      }
      else {
        peVar3 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_48);
        pAVar4 = _find_subcommand(peVar3,subc_name,ignore_disabled,ignore_used);
        if (pAVar4 != (App *)0x0) {
          return pAVar4;
        }
        local_70 = 0;
      }
    }
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

App *_find_subcommand(const std::string &subc_name, bool ignore_disabled, bool ignore_used) const noexcept {
        for(const App_p &com : subcommands_) {
            if(com->disabled_ && ignore_disabled)
                continue;
            if(com->get_name().empty()) {
                auto subc = com->_find_subcommand(subc_name, ignore_disabled, ignore_used);
                if(subc != nullptr) {
                    return subc;
                }
            } else if(com->check_name(subc_name)) {
                if((!*com) || !ignore_used)
                    return com.get();
            }
        }
        return nullptr;
    }